

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void process_definitions(Context *ctx)

{
  RegisterType RVar1;
  uint regnum;
  int iVar2;
  RegisterList *pRVar3;
  bool bVar4;
  uint uVar5;
  RegisterList *pRVar6;
  RegisterList *pRVar7;
  byte bVar8;
  int iVar9;
  RegisterList *in_RSI;
  uint uVar10;
  VariableList *pVVar11;
  RegisterList *pRVar12;
  RegisterList *pRVar13;
  RegisterList *local_38;
  
  determine_constants_arrays(ctx);
  local_38 = &ctx->uniforms;
  pRVar6 = (ctx->used_registers).next;
  pRVar12 = &ctx->attributes;
  pRVar13 = &ctx->used_registers;
  do {
    if (pRVar6 == (RegisterList *)0x0) {
      for (pVVar11 = ctx->variables; pVVar11 != (VariableList *)0x0; pVVar11 = pVVar11->next) {
        if (pVVar11->used != 0) {
          if (pVVar11->constant == (ConstantsList *)0x0) {
            (*ctx->profile->array_emitter)(ctx,pVVar11);
            ctx->uniform_float4_count = ctx->uniform_float4_count + pVVar11->count;
          }
          else {
            (*ctx->profile->const_array_emitter)
                      (ctx,pVVar11->constant,pVVar11->index,pVVar11->count);
          }
          ctx->uniform_count = ctx->uniform_count + 1;
        }
      }
      pRVar12 = (ctx->uniforms).next;
      if (pRVar12 != (RegisterList *)0x0) {
        pVVar11 = (VariableList *)0x0;
        do {
          bVar8 = 1;
          if (pRVar12->regtype == REG_TYPE_CONST) {
            pVVar11 = ctx->variables;
            if (pVVar11 == (VariableList *)0x0) {
              pVVar11 = (VariableList *)0x0;
            }
            else {
              iVar9 = -1;
              do {
                if (pVVar11->used != 0) {
                  bVar4 = true;
                  if ((pVVar11->index <= pRVar12->regnum) &&
                     (iVar2 = pVVar11->count, pRVar12->regnum < pVVar11->index + iVar2)) {
                    if (pVVar11->constant != (ConstantsList *)0x0) {
                      __assert_fail("!var->constant",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                    ,0x2e65,"void process_definitions(Context *)");
                    }
                    pRVar12->array = pVVar11;
                    bVar4 = false;
                    iVar9 = iVar2;
                  }
                  bVar8 = (byte)((uint)iVar9 >> 0x18);
                  if (!bVar4) goto LAB_00109f9f;
                }
                bVar8 = (byte)((uint)iVar9 >> 0x18);
                pVVar11 = pVVar11->next;
              } while (pVVar11 != (VariableList *)0x0);
              pVVar11 = (VariableList *)0x0;
LAB_00109f9f:
              bVar8 = bVar8 >> 7;
            }
          }
          (*ctx->profile->uniform_emitter)(ctx,pRVar12->regtype,pRVar12->regnum,pVVar11);
          if (bVar8 != 0) {
            ctx->uniform_count = ctx->uniform_count + 1;
            RVar1 = pRVar12->regtype;
            if (RVar1 == REG_TYPE_CONSTBOOL) {
              ctx->uniform_bool_count = ctx->uniform_bool_count + 1;
            }
            else if (RVar1 == REG_TYPE_CONSTINT) {
              ctx->uniform_int4_count = ctx->uniform_int4_count + 1;
            }
            else if (RVar1 == REG_TYPE_CONST) {
              ctx->uniform_float4_count = ctx->uniform_float4_count + 1;
            }
          }
          pRVar12 = pRVar12->next;
        } while (pRVar12 != (RegisterList *)0x0);
      }
      for (pRVar12 = (ctx->samplers).next; pRVar12 != (RegisterList *)0x0; pRVar12 = pRVar12->next)
      {
        ctx->sampler_count = ctx->sampler_count + 1;
        (*ctx->profile->sampler_emitter)
                  (ctx,pRVar12->regnum,pRVar12->index,SUB14(pRVar12->misc != 0,0));
      }
      for (pRVar12 = (ctx->attributes).next; pRVar12 != (RegisterList *)0x0; pRVar12 = pRVar12->next
          ) {
        ctx->attribute_count = ctx->attribute_count + 1;
        (*ctx->profile->attribute_emitter)
                  (ctx,pRVar12->regtype,pRVar12->regnum,pRVar12->usage,pRVar12->index,
                   pRVar12->writemask,pRVar12->misc);
      }
      return;
    }
    pRVar3 = pRVar6->next;
    RVar1 = pRVar6->regtype;
    regnum = pRVar6->regnum;
    uVar5 = RVar1 << 0x10 | regnum;
    pRVar7 = (ctx->defined_registers).next;
    do {
      if (pRVar7 == (RegisterList *)0x0) {
        in_RSI = (RegisterList *)0x0;
        break;
      }
      uVar10 = pRVar7->regtype << 0x10 | pRVar7->regnum;
      if (uVar5 == uVar10) {
        bVar4 = false;
        in_RSI = pRVar7;
      }
      else if (uVar5 < uVar10) {
        in_RSI = (RegisterList *)0x0;
        bVar4 = false;
      }
      else {
        pRVar7 = pRVar7->next;
        bVar4 = true;
      }
    } while (bVar4);
    bVar4 = true;
    pRVar7 = pRVar6;
    if (in_RSI == (RegisterList *)0x0) {
      switch(RVar1) {
      case REG_TYPE_TEMP:
      case REG_TYPE_ADDRESS:
      case REG_TYPE_LOOP:
      case REG_TYPE_LABEL:
      case REG_TYPE_MAX:
        in_RSI = (RegisterList *)(ulong)RVar1;
        (*ctx->profile->global_emitter)(ctx,RVar1,regnum);
        break;
      case REG_TYPE_INPUT:
        if ((ctx->shader_type != MOJOSHADER_TYPE_PIXEL) || (1 < ctx->major_ver))
        goto switchD_00109df6_caseD_a;
        in_RSI = pRVar12;
        pRVar6 = reglist_insert(ctx,pRVar12,REG_TYPE_INPUT,regnum);
        pRVar6->usage = MOJOSHADER_USAGE_COLOR;
        pRVar6->index = regnum;
        pRVar6->writemask = 0xf;
        pRVar6->misc = 0;
        break;
      case REG_TYPE_CONST:
      case REG_TYPE_CONSTINT:
      case REG_TYPE_CONSTBOOL:
        pRVar13->next = pRVar3;
        pRVar6->next = (RegisterList *)0x0;
        local_38->next = pRVar6;
        pRVar7 = pRVar13;
        local_38 = pRVar6;
        break;
      case REG_TYPE_RASTOUT:
      case REG_TYPE_ATTROUT:
      case REG_TYPE_OUTPUT:
      case REG_TYPE_COLOROUT:
      case REG_TYPE_DEPTHOUT:
        if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) && (2 < ctx->major_ver)) {
          bVar4 = false;
          in_RSI = (RegisterList *)0x12d97b;
          failf(ctx,"%s","vs_3 can\'t use output registers without declaring them first.");
          pRVar3 = pRVar6;
          pRVar7 = pRVar13;
        }
        else {
          in_RSI = pRVar12;
          pRVar6 = reglist_insert(ctx,pRVar12,RVar1,regnum);
          pRVar6->usage = MOJOSHADER_USAGE_UNKNOWN;
          pRVar6->index = 0;
          pRVar6->writemask = 0xf;
          pRVar6->misc = 0;
        }
        break;
      default:
switchD_00109df6_caseD_a:
        in_RSI = (RegisterList *)0x12d97b;
        failf(ctx,"%s","BUG: we used a register we don\'t know how to define.");
      }
    }
    pRVar6 = pRVar3;
    pRVar13 = pRVar7;
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

static void process_definitions(Context *ctx)
{
    // !!! FIXME: apparently, pre ps_3_0, sampler registers don't need to be
    // !!! FIXME:  DCL'd before use (default to 2d?). We aren't checking
    // !!! FIXME:  this at the moment, though.

    determine_constants_arrays(ctx);  // in case this hasn't been called yet.

    RegisterList *uitem = &ctx->uniforms;
    RegisterList *prev = &ctx->used_registers;
    RegisterList *item = prev->next;

    while (item != NULL)
    {
        RegisterList *next = item->next;
        const RegisterType regtype = item->regtype;
        const int regnum = item->regnum;

        if (!get_defined_register(ctx, regtype, regnum))
        {
            // haven't already dealt with this one.
            switch (regtype)
            {
                // !!! FIXME: I'm not entirely sure this is right...
                case REG_TYPE_RASTOUT:
                case REG_TYPE_ATTROUT:
                case REG_TYPE_TEXCRDOUT:
                case REG_TYPE_COLOROUT:
                case REG_TYPE_DEPTHOUT:
                    if (shader_is_vertex(ctx)&&shader_version_atleast(ctx,3,0))
                    {
                        fail(ctx, "vs_3 can't use output registers"
                                  " without declaring them first.");
                        return;
                    } // if

                    // Apparently this is an attribute that wasn't DCL'd.
                    //  Add it to the attribute list; deal with it later.
                    // !!! FIXME: we should use something other than UNKNOWN here.
                    add_attribute_register(ctx, regtype, regnum,
                                           MOJOSHADER_USAGE_UNKNOWN, 0, 0xF, 0);
                    break;

                case REG_TYPE_ADDRESS:
                case REG_TYPE_PREDICATE:
                case REG_TYPE_TEMP:
                case REG_TYPE_LOOP:
                case REG_TYPE_LABEL:
                    ctx->profile->global_emitter(ctx, regtype, regnum);
                    break;

                case REG_TYPE_CONST:
                case REG_TYPE_CONSTINT:
                case REG_TYPE_CONSTBOOL:
                    // separate uniforms into a different list for now.
                    prev->next = next;
                    item->next = NULL;
                    uitem->next = item;
                    uitem = item;
                    item = prev;
                    break;

                case REG_TYPE_INPUT:
                    // You don't have to dcl_ your inputs in Shader Model 1.
                    if (shader_is_pixel(ctx)&&!shader_version_atleast(ctx,2,0))
                    {
                        add_attribute_register(ctx, regtype, regnum,
                                               MOJOSHADER_USAGE_COLOR, regnum,
                                               0xF, 0);
                        break;
                    } // if
                    // fall through...

                default:
                    fail(ctx, "BUG: we used a register we don't know how to define.");
            } // switch
        } // if

        prev = item;
        item = next;
    } // while

    // okay, now deal with uniform/constant arrays...
    VariableList *var;
    for (var = ctx->variables; var != NULL; var = var->next)
    {
        if (var->used)
        {
            if (var->constant)
            {
                ctx->profile->const_array_emitter(ctx, var->constant,
                                                  var->index, var->count);
            } // if
            else
            {
                ctx->profile->array_emitter(ctx, var);
                ctx->uniform_float4_count += var->count;
            } // else
            ctx->uniform_count++;
        } // if
    } // for

    // ...and uniforms...
    for (item = ctx->uniforms.next; item != NULL; item = item->next)
    {
        int arraysize = -1;

        // check if this is a register contained in an array...
        if (item->regtype == REG_TYPE_CONST)
        {
            for (var = ctx->variables; var != NULL; var = var->next)
            {
                if (!var->used)
                    continue;

                const int regnum = item->regnum;
                const int lo = var->index;
                if ( (regnum >= lo) && (regnum < (lo + var->count)) )
                {
                    assert(!var->constant);
                    item->array = var;  // used when building parseData.
                    arraysize = var->count;
                    break;
                } // if
            } // for
        } // if

        ctx->profile->uniform_emitter(ctx, item->regtype, item->regnum, var);

        if (arraysize < 0)  // not part of an array?
        {
            ctx->uniform_count++;
            switch (item->regtype)
            {
                case REG_TYPE_CONST: ctx->uniform_float4_count++; break;
                case REG_TYPE_CONSTINT: ctx->uniform_int4_count++; break;
                case REG_TYPE_CONSTBOOL: ctx->uniform_bool_count++; break;
                default: break;
            } // switch
        } // if
    } // for

    // ...and samplers...
    for (item = ctx->samplers.next; item != NULL; item = item->next)
    {
        ctx->sampler_count++;
        ctx->profile->sampler_emitter(ctx, item->regnum,
                                      (TextureType) item->index,
                                      item->misc != 0);
    } // for

    // ...and attributes...
    for (item = ctx->attributes.next; item != NULL; item = item->next)
    {
        ctx->attribute_count++;
        ctx->profile->attribute_emitter(ctx, item->regtype, item->regnum,
                                        item->usage, item->index,
                                        item->writemask, item->misc);
    } // for
}